

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu_x86.c
# Opt level: O0

ND_BOOL ShemuX86EvalCondition(SHEMU_CONTEXT *Context,ND_UINT8 ConditionCode)

{
  ND_UINT8 ConditionCode_local;
  SHEMU_CONTEXT *Context_local;
  
  switch(ConditionCode) {
  case '\0':
    if (((Context->Arch).X86.Registers.RegFlags & 0x800) != 0) {
      return '\x01';
    }
    break;
  case '\x01':
    if (((Context->Arch).X86.Registers.RegFlags & 0x800) == 0) {
      return '\x01';
    }
    break;
  case '\x02':
    if (((Context->Arch).X86.Registers.RegFlags & 1) != 0) {
      return '\x01';
    }
    break;
  case '\x03':
    if (((Context->Arch).X86.Registers.RegFlags & 1) == 0) {
      return '\x01';
    }
    break;
  case '\x04':
    if (((Context->Arch).X86.Registers.RegFlags & 0x40) != 0) {
      return '\x01';
    }
    break;
  case '\x05':
    if (((Context->Arch).X86.Registers.RegFlags & 0x40) == 0) {
      return '\x01';
    }
    break;
  case '\x06':
    if (((Context->Arch).X86.Registers.RegFlags & 1) != 0 ||
        ((Context->Arch).X86.Registers.RegFlags & 0x40) != 0) {
      return '\x01';
    }
    break;
  case '\a':
    if (((Context->Arch).X86.Registers.RegFlags & 1) == 0 &&
        ((Context->Arch).X86.Registers.RegFlags & 0x40) == 0) {
      return '\x01';
    }
    break;
  case '\b':
    if (((Context->Arch).X86.Registers.RegFlags & 0x80) != 0) {
      return '\x01';
    }
    break;
  case '\t':
    if (((Context->Arch).X86.Registers.RegFlags & 0x80) == 0) {
      return '\x01';
    }
    break;
  case '\n':
    if (((Context->Arch).X86.Registers.RegFlags & 4) != 0) {
      return '\x01';
    }
    break;
  case '\v':
    if (((Context->Arch).X86.Registers.RegFlags & 4) == 0) {
      return '\x01';
    }
    break;
  case '\f':
    if ((((Context->Arch).X86.Registers.RegFlags & 0x80) != 0) !=
        (((Context->Arch).X86.Registers.RegFlags & 0x800) != 0)) {
      return '\x01';
    }
    break;
  case '\r':
    if ((((Context->Arch).X86.Registers.RegFlags & 0x80) != 0) ==
        (((Context->Arch).X86.Registers.RegFlags & 0x800) != 0)) {
      return '\x01';
    }
    break;
  case '\x0e':
    if ((((Context->Arch).X86.Registers.RegFlags & 0x80) != 0) !=
        (((Context->Arch).X86.Registers.RegFlags & 0x800) != 0) ||
        ((Context->Arch).X86.Registers.RegFlags & 0x40) != 0) {
      return '\x01';
    }
    break;
  case '\x0f':
    if ((((Context->Arch).X86.Registers.RegFlags & 0x80) != 0) ==
        (((Context->Arch).X86.Registers.RegFlags & 0x800) != 0) &&
        ((Context->Arch).X86.Registers.RegFlags & 0x40) == 0) {
      return '\x01';
    }
  }
  return '\0';
}

Assistant:

static ND_BOOL
ShemuX86EvalCondition(
    SHEMU_CONTEXT *Context,
    ND_UINT8 ConditionCode
    )
{
    switch (ConditionCode)
    {
    case ND_COND_OVERFLOW: // O
        if (GET_FLAG(Context, NDR_RFLAG_OF) == 1)
        {
            return ND_TRUE;
        }
        break;
    case ND_COND_NOT(ND_COND_OVERFLOW): // NO
        if (GET_FLAG(Context, NDR_RFLAG_OF) == 0)
        {
            return ND_TRUE;
        }
        break;
    case ND_COND_CARRY: // C/B/NAE
        if (GET_FLAG(Context, NDR_RFLAG_CF) == 1)
        {
            return ND_TRUE;
        }
        break;
    case ND_COND_NOT(ND_COND_CARRY): // NC/NB/AE
        if (GET_FLAG(Context, NDR_RFLAG_CF) == 0)
        {
            return ND_TRUE;
        }
        break;
    case ND_COND_ZERO: // E/Z
        if (GET_FLAG(Context, NDR_RFLAG_ZF) == 1)
        {
            return ND_TRUE;
        }
        break;
    case ND_COND_NOT(ND_COND_ZERO): // NE/NZ
        if (GET_FLAG(Context, NDR_RFLAG_ZF) == 0)
        {
            return ND_TRUE;
        }
        break;
    case ND_COND_BELOW_OR_EQUAL: // BE/NA
        if ((GET_FLAG(Context, NDR_RFLAG_CF) | (GET_FLAG(Context, NDR_RFLAG_ZF))) == 1)
        {
            return ND_TRUE;
        }
        break;
    case ND_COND_NOT(ND_COND_BELOW_OR_EQUAL): // A/NBE
        if ((GET_FLAG(Context, NDR_RFLAG_CF) | (GET_FLAG(Context, NDR_RFLAG_ZF))) == 0)
        {
            return ND_TRUE;
        }
        break;
    case ND_COND_SIGN: // S
        if (GET_FLAG(Context, NDR_RFLAG_SF) == 1)
        {
            return ND_TRUE;
        }
        break;
    case ND_COND_NOT(ND_COND_SIGN): // NS
        if (GET_FLAG(Context, NDR_RFLAG_SF) == 0)
        {
            return ND_TRUE;
        }
        break;
    case ND_COND_PARITY: // P
        if (GET_FLAG(Context, NDR_RFLAG_PF) == 1)
        {
            return ND_TRUE;
        }
        break;
    case ND_COND_NOT(ND_COND_PARITY): // NP
        if (GET_FLAG(Context, NDR_RFLAG_PF) == 0)
        {
            return ND_TRUE;
        }
        break;
    case ND_COND_LESS: // L/NGE
        if ((GET_FLAG(Context, NDR_RFLAG_SF) ^ GET_FLAG(Context, NDR_RFLAG_OF)) == 1)
        {
            return ND_TRUE;
        }
        break;
    case ND_COND_NOT(ND_COND_LESS): // NL/GE
        if ((GET_FLAG(Context, NDR_RFLAG_SF) ^ GET_FLAG(Context, NDR_RFLAG_OF)) == 0)
        {
            return ND_TRUE;
        }
        break;
    case ND_COND_LESS_OR_EQUAL: // LE/NG
        if (((GET_FLAG(Context, NDR_RFLAG_SF) ^ GET_FLAG(Context, NDR_RFLAG_OF)) |
            (GET_FLAG(Context, NDR_RFLAG_ZF))) == 1)
        {
            return ND_TRUE;
        }
        break;
    case ND_COND_NOT(ND_COND_LESS_OR_EQUAL): // NLE/G
        if (((GET_FLAG(Context, NDR_RFLAG_SF) ^ GET_FLAG(Context, NDR_RFLAG_OF)) |
            (GET_FLAG(Context, NDR_RFLAG_ZF))) == 0)
        {
            return ND_TRUE;
        }
        break;
    }

    return ND_FALSE;
}